

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec08.c
# Opt level: O3

void If_Dec08MoveTo(word *pF,int nVars,int v,int p,int *Pla2Var,int *Var2Pla)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  word *pwVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  word *pwVar11;
  ulong uVar12;
  int iVar13;
  word *pwVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  word pG [16];
  word local_b8 [17];
  
  iVar13 = Var2Pla[v];
  if (p < iVar13) {
    __assert_fail("Var2Pla[v] <= p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                  ,0xf4,"void If_Dec08MoveTo(word *, int, int, int, int *, int *)");
  }
  if (iVar13 != p) {
    uVar8 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar8 = 1;
    }
    pwVar5 = pF;
    pwVar11 = local_b8;
    bVar6 = false;
    do {
      bVar7 = bVar6;
      pwVar14 = pwVar11;
      pwVar11 = pwVar5;
      if (nVars + -1 <= iVar13) {
        __assert_fail("iVar < nVars - 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                      ,0xcf,"void If_Dec08SwapAdjacent(word *, word *, int, int)");
      }
      if (iVar13 < 5) {
        if (0 < (int)uVar8) {
          uVar12 = PMasks[iVar13][0];
          uVar2 = PMasks[iVar13][1];
          uVar3 = PMasks[iVar13][2];
          uVar15 = 0;
          do {
            uVar4 = pwVar11[uVar15];
            bVar10 = (byte)(1 << ((byte)iVar13 & 0x1f));
            pwVar14[uVar15] =
                 (uVar4 & uVar3) >> (bVar10 & 0x3f) |
                 (uVar4 & uVar2) << (bVar10 & 0x3f) | uVar4 & uVar12;
            uVar15 = uVar15 + 1;
          } while (uVar8 != uVar15);
        }
      }
      else if (iVar13 == 5) {
        if (0 < (int)uVar8) {
          uVar12 = 0;
          do {
            uVar2 = pwVar11[uVar12];
            uVar3 = pwVar11[uVar12 + 1];
            pwVar14[uVar12] = uVar3 << 0x20 | uVar2 & 0xffffffff;
            pwVar14[uVar12 + 1] = uVar2 >> 0x20 | uVar3 & 0xffffffff00000000;
            uVar12 = uVar12 + 2;
          } while (uVar12 < uVar8);
        }
      }
      else if (0 < (int)uVar8) {
        lVar9 = 0;
        do {
          pwVar14[lVar9] = pwVar11[lVar9];
          auVar1 = *(undefined1 (*) [16])(pwVar11 + lVar9 + 1);
          auVar16._0_8_ = auVar1._8_8_;
          auVar16._8_4_ = auVar1._0_4_;
          auVar16._12_4_ = auVar1._4_4_;
          *(undefined1 (*) [16])(pwVar14 + lVar9 + 1) = auVar16;
          pwVar14[lVar9 + 3] = pwVar11[lVar9 + 3];
          lVar9 = lVar9 + 4;
        } while ((int)lVar9 < (int)uVar8);
      }
      Var2Pla[Pla2Var[iVar13]] = Var2Pla[Pla2Var[iVar13]] + 1;
      Var2Pla[Pla2Var[(long)iVar13 + 1]] = Var2Pla[Pla2Var[(long)iVar13 + 1]] + -1;
      *(ulong *)(Pla2Var + iVar13) =
           CONCAT44((int)*(undefined8 *)(Pla2Var + iVar13),
                    (int)((ulong)*(undefined8 *)(Pla2Var + iVar13) >> 0x20));
      iVar13 = Var2Pla[v];
      pwVar5 = pwVar14;
      bVar6 = (bool)(bVar7 ^ 1);
    } while (iVar13 != p);
    if (!bVar7) {
      uVar8 = 1 << ((char)nVars - 6U & 0x1f);
      if (nVars < 7) {
        uVar8 = 1;
      }
      if (0 < (int)uVar8) {
        uVar12 = 0;
        do {
          pF[uVar12] = pwVar14[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar8 != uVar12);
      }
    }
  }
  if (Pla2Var[(uint)p] != v) {
    __assert_fail("Pla2Var[p] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                  ,0x104,"void If_Dec08MoveTo(word *, int, int, int, int *, int *)");
  }
  return;
}

Assistant:

static inline void If_Dec08MoveTo( word * pF, int nVars, int v, int p, int Pla2Var[], int Var2Pla[] )
{
    word pG[16], * pIn = pF, * pOut = pG, * pTemp;
    int iPlace0, iPlace1, Count = 0;
    assert( Var2Pla[v] <= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v];
        iPlace1 = Var2Pla[v]+1;
        If_Dec08SwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    if ( Count & 1 )
        If_Dec08Copy( pF, pIn, nVars );
    assert( Pla2Var[p] == v );
}